

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.h
# Opt level: O0

NeuralNetworkClassifier * __thiscall
CoreML::Specification::Model::mutable_neuralnetworkclassifier(Model *this)

{
  bool bVar1;
  NeuralNetworkClassifier *this_00;
  Model *this_local;
  
  bVar1 = has_neuralnetworkclassifier(this);
  if (!bVar1) {
    clear_Type(this);
    set_has_neuralnetworkclassifier(this);
    this_00 = (NeuralNetworkClassifier *)operator_new(0x68);
    NeuralNetworkClassifier::NeuralNetworkClassifier(this_00);
    (this->Type_).neuralnetworkclassifier_ = this_00;
  }
  return (NeuralNetworkClassifier *)(this->Type_).pipelineclassifier_;
}

Assistant:

inline ::CoreML::Specification::NeuralNetworkClassifier* Model::mutable_neuralnetworkclassifier() {
  if (!has_neuralnetworkclassifier()) {
    clear_Type();
    set_has_neuralnetworkclassifier();
    Type_.neuralnetworkclassifier_ = new ::CoreML::Specification::NeuralNetworkClassifier;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Model.neuralNetworkClassifier)
  return Type_.neuralnetworkclassifier_;
}